

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

string * __thiscall
duckdb::BindContext::GetActualColumnName
          (string *__return_storage_ptr__,BindContext *this,Binding *binding,string *column_name)

{
  bool bVar1;
  reference pvVar2;
  InternalException *this_00;
  allocator local_89;
  column_t binding_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  bVar1 = Binding::TryGetBindingIndex(binding,column_name,&binding_index);
  if (bVar1) {
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&binding->names,binding_index);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Binding with name \"%s\" does not have a column named \"%s\"",
             &local_89);
  Binding::GetAlias_abi_cxx11_(&local_60,binding);
  ::std::__cxx11::string::string((string *)&local_80,(string *)column_name);
  InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_40,&local_60,&local_80);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string BindContext::GetActualColumnName(Binding &binding, const string &column_name) {
	column_t binding_index;
	if (!binding.TryGetBindingIndex(column_name, binding_index)) { // LCOV_EXCL_START
		throw InternalException("Binding with name \"%s\" does not have a column named \"%s\"", binding.GetAlias(),
		                        column_name);
	} // LCOV_EXCL_STOP
	return binding.names[binding_index];
}